

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                   *this,unsigned_long *Key)

{
  bool bVar1;
  DenseMapPair<unsigned_long,_unsigned_long> *in_RAX;
  DenseMapPair<unsigned_long,_unsigned_long> *local_28;
  DenseMapPair<unsigned_long,_unsigned_long> *ConstFoundBucket;
  
  local_28 = in_RAX;
  bVar1 = LookupBucketFor<unsigned_long>(this,Key,&local_28);
  if (!bVar1) {
    local_28 = InsertIntoBucketImpl<unsigned_long>(this,Key,Key,local_28);
    (local_28->super_pair<unsigned_long,_unsigned_long>).first = *Key;
    (local_28->super_pair<unsigned_long,_unsigned_long>).second = 0;
  }
  return local_28;
}

Assistant:

value_type& FindAndConstruct(KeyT &&Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, std::move(Key));
  }